

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O3

int main(void)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  
  bVar1 = test();
  if (bVar1) {
    pcVar3 = "your code is ok!";
    lVar2 = 0x10;
  }
  else {
    pcVar3 = "you have a bug of some kind";
    lVar2 = 0x1b;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
  bool ok(test());
  if (ok)
    cout << "your code is ok!" << endl;
  else
    cout << "you have a bug of some kind" << endl;
  return 0;
}